

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_SubDEdge::TopologyHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDEdge *this,bool bIncludeSubdivisionProperties
          )

{
  ON_SubDVertex *this_00;
  ulong uVar1;
  bool bVar2;
  ushort uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  ON_SubDFacePtr *pOVar6;
  uint i;
  long lVar7;
  double dVar8;
  ON_SubDEdgeSharpness s;
  ON_SHA1 sha1;
  
  ON_SHA1::ON_SHA1(&sha1);
  ON_SHA1::AccumulateInteger32(&sha1,(this->super_ON_SubDComponentBase).m_id);
  if ((int)CONCAT71(in_register_00000011,bIncludeSubdivisionProperties) != 0) {
    s = Sharpness(this,true);
    dVar8 = ON_SubDEdgeSharpness::operator[](&s,0);
    ON_SHA1::AccumulateDouble(&sha1,dVar8);
    dVar8 = ON_SubDEdgeSharpness::operator[](&s,1);
    ON_SHA1::AccumulateDouble(&sha1,dVar8);
  }
  for (lVar7 = -0x10; lVar7 != 0; lVar7 = lVar7 + 8) {
    this_00 = *(ON_SubDVertex **)((long)this->m_sector_coefficient + lVar7);
    if (this_00 == (ON_SubDVertex *)0x0) {
      ON_SHA1::AccumulateInteger32(&sha1,-1);
    }
    else {
      ON_SHA1::AccumulateInteger32(&sha1,(this_00->super_ON_SubDComponentBase).m_id);
      if (bIncludeSubdivisionProperties) {
        ON_SHA1::AccumulateDoubleArray(&sha1,3,this_00->m_P);
        bVar2 = ON_SubDVertex::IsDartOrCreaseOrCorner(this_00);
        if (bVar2) {
          ON_SHA1::AccumulateDouble
                    (&sha1,*(double *)((long)(this->m_sharpness).m_edge_sharpness + lVar7));
        }
      }
    }
  }
  ON_SHA1::AccumulateInteger16(&sha1,this->m_face_count);
  pOVar6 = this->m_face2;
  uVar5 = 0;
  while( true ) {
    uVar3 = this->m_face_count;
    if (uVar3 <= uVar5) goto LAB_00601c7a;
    if ((uVar5 == 2) && (pOVar6 = this->m_facex, pOVar6 == (ON_SubDFacePtr *)0x0)) break;
    uVar1 = pOVar6->m_ptr;
    uVar4 = uVar1 & 0xfffffffffffffff8;
    i = 0xffffffff;
    if (uVar4 != 0) {
      ON_SHA1::AccumulateInteger32(&sha1,*(ON__INT32 *)(uVar4 + 8));
      i = (uint)uVar1 & 1;
    }
    pOVar6 = pOVar6 + 1;
    ON_SHA1::AccumulateInteger32(&sha1,i);
    uVar5 = uVar5 + 1;
  }
  for (uVar5 = 2; uVar5 < uVar3; uVar5 = uVar5 + 1) {
    ON_SHA1::AccumulateInteger32(&sha1,-1);
    uVar3 = this->m_face_count;
  }
LAB_00601c7a:
  ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDEdge::TopologyHash(bool bIncludeSubdivisionProperties) const
{
  ON_SHA1 sha1;
  sha1.AccumulateInteger32(m_id);
  if (bIncludeSubdivisionProperties)
  {
    // passing true here includes the edge tag in the hash.
    const ON_SubDEdgeSharpness s = this->Sharpness(true);
    sha1.AccumulateDouble(s[0]);
    sha1.AccumulateDouble(s[1]);
  }
  for (unsigned evi = 0; evi < 2; ++evi)
  {
    const ON_SubDVertex* v = this->m_vertex[evi];    
    if (nullptr == v)
      sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
    else
    {
      sha1.AccumulateInteger32(v->m_id);
      if (bIncludeSubdivisionProperties)
      {
        sha1.AccumulateDoubleArray(3, v->m_P);
        if (v->IsDartOrCreaseOrCorner())
          sha1.AccumulateDouble(this->m_sector_coefficient[evi]);
      }
    }
  }

  sha1.AccumulateInteger16(this->m_face_count);
  const ON_SubDFacePtr* ef = this->m_face2;
  for (unsigned short efi = 0; efi < this->m_face_count; ++efi)
  {
    if (2 == efi)
    {
      ef = this->m_facex;
      if (nullptr == ef)
      {
        while (efi < this->m_face_count)
        {
          sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
          ++efi;
        }
        break;
      }
    }
    const ON_SubDFacePtr fptr = *ef++;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr.m_ptr);
    if (nullptr == f)
    {
      sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
    }
    else
    {
      sha1.AccumulateInteger32(f->m_id);
      sha1.AccumulateInteger32((ON__UINT32)ON_SUBD_FACE_DIRECTION(fptr.m_ptr));
    }
  }

  return sha1.Hash();
}